

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

void __thiscall tinyxml2::XMLPrinter::OpenElement(XMLPrinter *this,char *name,bool compactMode)

{
  byte ch;
  byte in_DL;
  XMLPrinter *in_RSI;
  XMLPrinter *in_RDI;
  char *in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe8;
  
  ch = in_DL & 1;
  SealElementIfJustOpened(in_RDI);
  DynArray<const_char_*,_10>::Push((DynArray<const_char_*,_10> *)in_RDI,in_stack_ffffffffffffffd8);
  if (((in_RDI->_textDepth < 0) && ((in_RDI->_firstElement & 1U) == 0)) && ((ch & 1) == 0)) {
    Putc(in_RSI,ch);
    (*(in_RDI->super_XMLVisitor)._vptr_XMLVisitor[0xc])(in_RDI,(ulong)(uint)in_RDI->_depth);
  }
  Write(in_RSI,(char *)CONCAT17(ch,in_stack_ffffffffffffffe8));
  Write(in_RSI,(char *)CONCAT17(ch,in_stack_ffffffffffffffe8));
  in_RDI->_elementJustOpened = true;
  in_RDI->_firstElement = false;
  in_RDI->_depth = in_RDI->_depth + 1;
  return;
}

Assistant:

void XMLPrinter::OpenElement( const char* name, bool compactMode )
{
    SealElementIfJustOpened();
    _stack.Push( name );

    if ( _textDepth < 0 && !_firstElement && !compactMode ) {
        Putc( '\n' );
        PrintSpace( _depth );
    }

    Write ( "<" );
    Write ( name );

    _elementJustOpened = true;
    _firstElement = false;
    ++_depth;
}